

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateCharacterState.cpp
# Opt level: O3

string * __thiscall
CreateCharacterState::ShowStats_abi_cxx11_
          (string *__return_storage_ptr__,CreateCharacterState *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"1 Strength      : ",0x12);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,this->m_str);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"2 Endurance     : ",0x12);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,this->m_end);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"3 Intelligence  : ",0x12);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,this->m_int);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"4 Dexterity     : ",0x12);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,this->m_dex);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"5 Skill         : ",0x12);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,this->m_skill);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Points remaining: ",0x12);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,this->m_att_points);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\r\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string CreateCharacterState::ShowStats() {
    std::stringstream ss;
    ss << "1 Strength      : " << m_str << "\r\n";
    ss << "2 Endurance     : " << m_end << "\r\n";
    ss << "3 Intelligence  : " << m_int << "\r\n";
    ss << "4 Dexterity     : " << m_dex << "\r\n";
    ss << "5 Skill         : " << m_skill << "\r\n";
    ss << "Points remaining: " << m_att_points << "\r\n";
    return ss.str();
}